

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall
gulps::message::print_text_abi_cxx11_(string *__return_storage_ptr__,message *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->text);
  if ((this->text)._M_dataplus._M_p[(this->text)._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_text() const
		{
			std::string out = text;
			if(text.back() != '\n')
				out += '\n';
			return out;
		}